

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

Gia_Man_t * Gia_ManRex2Gia(char *pStrInit,int fOrder,int fVerbose)

{
  char cVar1;
  byte bVar2;
  int *piVar3;
  Vec_Int_t *p;
  uint nRegs;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iLit1;
  uint uVar9;
  char *pStr;
  size_t sVar10;
  Gia_Man_t *pGVar11;
  size_t sVar12;
  char *pcVar13;
  Gia_Obj_t *pGVar14;
  Vec_Int_t *pVVar15;
  Vec_Int_t *vStaTrans;
  Vec_Int_t *vLits;
  Vec_Int_t *vVisited;
  int *__ptr;
  void *__s;
  Gia_Man_t *p_00;
  int i;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint v;
  long lVar20;
  Vec_Int_t *vStr2Sta;
  Vec_Int_t *vAlphas;
  
  pStr = Gia_ManRexPreprocess(pStrInit);
  nRegs = Gia_ManRexNumInputs(pStr,&vAlphas,&vStr2Sta);
  sVar10 = strlen(pStr);
  if (fOrder != 0) {
    qsort(vAlphas->pArray,(long)vAlphas->nSize,4,Vec_IntSortCompare1);
  }
  printf("Input variable order: ");
  for (iVar19 = 0; iVar19 < vAlphas->nSize; iVar19 = iVar19 + 1) {
    iVar4 = Vec_IntEntry(vAlphas,iVar19);
    putchar((int)(char)iVar4);
  }
  putchar(10);
  pGVar11 = Gia_ManStart(1000);
  iVar19 = 0;
  if (pStrInit == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pStrInit);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pStrInit);
  }
  pGVar11->pName = pcVar13;
  for (; iVar19 < (int)(vAlphas->nSize + nRegs); iVar19 = iVar19 + 1) {
    pGVar14 = Gia_ManAppendObj(pGVar11);
    uVar17 = *(ulong *)pGVar14;
    *(ulong *)pGVar14 = uVar17 | 0x9fffffff;
    *(ulong *)pGVar14 =
         uVar17 & 0xe0000000ffffffff | 0x9fffffff |
         (ulong)(pGVar11->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar15 = pGVar11->vCis;
    iVar4 = Gia_ObjId(pGVar11,pGVar14);
    Vec_IntPush(pVVar15,iVar4);
    Gia_ObjId(pGVar11,pGVar14);
  }
  iVar19 = nRegs + 1;
  pVVar15 = Vec_IntAlloc(iVar19);
  pVVar15->nSize = iVar19;
  if (pVVar15->pArray != (int *)0x0) {
    memset(pVVar15->pArray,0,(long)iVar19 * 4);
  }
  iVar4 = (int)sVar10;
  vStaTrans = Vec_IntStartFull(iVar4);
  vLits = Vec_IntAlloc(iVar4);
  vVisited = Vec_IntStartFull(iVar4 + 1);
  uVar16 = 0;
  uVar17 = sVar10 & 0xffffffff;
  if (iVar4 < 1) {
    uVar17 = uVar16;
  }
  do {
    if (uVar17 == uVar16) {
      if (vLits->nSize != 0) {
        __assert_fail("Vec_IntSize(vStack) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                      ,0xfe,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
      }
      if (fVerbose != 0) {
        Gia_ManPrintAutom(pStr,vStaTrans);
      }
      Gia_ManHashAlloc(pGVar11);
      iVar5 = 1;
      for (lVar20 = 1; lVar20 < iVar4; lVar20 = lVar20 + 1) {
        bVar2 = pStr[lVar20];
        if ((2 < bVar2 - 0x28) && (bVar2 != 0x7c)) {
          iVar7 = (int)lVar20;
          Gia_ManCollectReached(pStr,vStaTrans,iVar7,vLits,vVisited,iVar5);
          if (fVerbose != 0) {
            Gia_ManPrintReached(pStr,iVar7,vLits);
          }
          iVar5 = iVar5 + 1;
          iVar7 = Vec_IntEntry(vStr2Sta,iVar7);
          pGVar14 = Gia_ManPi(pGVar11,iVar7 + vAlphas->nSize);
          iVar7 = Gia_Obj2Lit(pGVar11,pGVar14);
          iVar6 = Vec_IntFind(vAlphas,(int)(char)bVar2);
          pGVar14 = Gia_ManPi(pGVar11,iVar6);
          iVar6 = Gia_Obj2Lit(pGVar11,pGVar14);
          iVar6 = Gia_ManHashAnd(pGVar11,iVar7,iVar6);
          i = 0;
          iVar7 = vLits->nSize;
          if (vLits->nSize < 1) {
            iVar7 = i;
          }
          for (; iVar7 != i; i = i + 1) {
            iVar8 = Vec_IntEntry(vLits,i);
            iVar8 = Vec_IntEntry(vStr2Sta,iVar8);
            iLit1 = Vec_IntEntry(pVVar15,iVar8);
            iVar6 = Gia_ManHashOr(pGVar11,iVar6,iLit1);
            Vec_IntWriteEntry(pVVar15,iVar8,iVar6);
          }
        }
      }
      vLits->nSize = 0;
      for (iVar4 = 0; iVar4 < vAlphas->nSize; iVar4 = iVar4 + 1) {
        pGVar14 = Gia_ManPi(pGVar11,iVar4);
        iVar7 = Gia_Obj2Lit(pGVar11,pGVar14);
        Vec_IntPush(vLits,iVar7);
      }
      iVar4 = Gia_ManBuild1Hot(pGVar11,vLits);
      for (iVar7 = 0; iVar7 <= (int)nRegs; iVar7 = iVar7 + 1) {
        iVar6 = Vec_IntEntry(pVVar15,iVar7);
        iVar6 = Gia_ManHashAnd(pGVar11,iVar4,iVar6);
        Vec_IntWriteEntry(pVVar15,iVar7,iVar6);
      }
      Gia_ManHashStop(pGVar11);
      Gia_ManCollectReached(pStr,vStaTrans,0,vLits,vVisited,iVar5);
      if (fVerbose != 0) {
        Gia_ManPrintReached(pStr,0,vLits);
      }
      __ptr = (int *)malloc(0x10);
      iVar4 = iVar19;
      if (nRegs < 0xf) {
        iVar4 = 0x10;
      }
      *__ptr = iVar4;
      uVar17 = 0;
      if (iVar4 == 0) {
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)iVar4);
      }
      *(void **)(__ptr + 2) = __s;
      memset(__s,0,(long)iVar19);
      __ptr[1] = nRegs;
      uVar16 = 0;
      if (0 < (int)nRegs) {
        uVar16 = (ulong)nRegs;
      }
      for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
        *(undefined1 *)((long)__s + uVar17) = 0x30;
      }
      iVar19 = vLits->nSize;
      iVar4 = 0;
      if (iVar19 < 1) {
        iVar19 = 0;
        iVar4 = 0;
      }
      for (; iVar19 != iVar4; iVar4 = iVar4 + 1) {
        iVar5 = Vec_IntEntry(vLits,iVar4);
        if (pStr[iVar5] != '\0') {
          uVar9 = Vec_IntEntry(vStr2Sta,iVar5);
          if (((int)uVar9 < 0) || ((int)nRegs <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          *(undefined1 *)((long)__s + (ulong)uVar9) = 0x31;
        }
      }
      if (fVerbose != 0) {
        printf("Init state = %s\n",__s);
      }
      iVar19 = Vec_IntPop(pVVar15);
      uVar9 = pVVar15->nSize;
      if (uVar9 == pVVar15->nCap) {
        iVar4 = uVar9 * 2;
        if ((int)uVar9 < 0x10) {
          iVar4 = 0x10;
        }
        Vec_IntGrow(pVVar15,iVar4);
        uVar9 = pVVar15->nSize;
      }
      pVVar15->nSize = uVar9 + 1;
      piVar3 = pVVar15->pArray;
      for (uVar17 = (ulong)uVar9; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
        piVar3[uVar17] = piVar3[uVar17 - 1];
      }
      *piVar3 = iVar19;
      if (uVar9 != nRegs) {
        __assert_fail("Vec_IntSize(vStaLits) == nStates + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                      ,0x130,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
      }
      iVar19 = 0;
      while( true ) {
        if ((int)nRegs < iVar19) {
          Gia_ManSetRegNum(pGVar11,nRegs);
          p_00 = Gia_ManCleanup(pGVar11);
          Gia_ManStop(pGVar11);
          pcVar13 = *(char **)(__ptr + 2);
          pGVar11 = Gia_ManDupZeroUndc(p_00,pcVar13,0,0,0);
          Gia_ManStop(p_00);
          free(pcVar13);
          free(__ptr);
          Vec_IntFree(vAlphas);
          Vec_IntFree(vStr2Sta);
          Vec_IntFree(pVVar15);
          Vec_IntFree(vStaTrans);
          Vec_IntFree(vLits);
          Vec_IntFree(vVisited);
          free(pStr);
          return pGVar11;
        }
        uVar9 = Vec_IntEntry(pVVar15,iVar19);
        if (((int)uVar9 < 0) || (v = uVar9 >> 1, pGVar11->nObjs <= (int)v)) break;
        pGVar14 = Gia_ManObj(pGVar11,v);
        if ((~*(uint *)pGVar14 & 0x1fffffff) != 0 && (int)*(uint *)pGVar14 < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar14 = Gia_ManAppendObj(pGVar11);
        *(ulong *)pGVar14 = *(ulong *)pGVar14 | 0x80000000;
        iVar4 = Gia_ObjId(pGVar11,pGVar14);
        uVar16 = (ulong)(iVar4 - v & 0x1fffffff);
        uVar17 = *(ulong *)pGVar14;
        uVar18 = (ulong)((uVar9 & 1) << 0x1d);
        *(ulong *)pGVar14 = uVar18 | uVar17 & 0xffffffffc0000000 | uVar16;
        *(ulong *)pGVar14 =
             uVar18 | uVar17 & 0xe0000000c0000000 | uVar16 |
             (ulong)(pGVar11->vCos->nSize & 0x1fffffff) << 0x20;
        p = pGVar11->vCos;
        iVar4 = Gia_ObjId(pGVar11,pGVar14);
        Vec_IntPush(p,iVar4);
        if (pGVar11->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pGVar11,pGVar14 + -(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff),
                           pGVar14);
        }
        Gia_ObjId(pGVar11,pGVar14);
        iVar19 = iVar19 + 1;
      }
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    cVar1 = pStr[uVar16];
    iVar7 = (int)uVar16;
    iVar5 = iVar7;
    if (cVar1 == '(') {
LAB_0061a8a3:
      Vec_IntPush(vLits,iVar7);
    }
    else if (cVar1 == ')') {
      iVar5 = Vec_IntPop(vLits);
      if (pStr[iVar5] == '|') {
        iVar6 = Vec_IntPop(vLits);
        Vec_IntWriteEntry(vStaTrans,iVar6,iVar5 + 1);
        Vec_IntWriteEntry(vStaTrans,iVar5,iVar7);
        iVar5 = iVar6;
      }
    }
    else if (cVar1 == '|') goto LAB_0061a8a3;
    if (((long)uVar16 < (long)(iVar4 + -1)) && (pStr[uVar16 + 1] == '*')) {
      Vec_IntWriteEntry(vStaTrans,iVar5,iVar7 + 1);
      Vec_IntWriteEntry(vStaTrans,iVar7 + 1,iVar5);
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManRex2Gia( char * pStrInit, int fOrder, int fVerbose )
{
    Gia_Man_t * pNew = NULL, * pTemp; 
    Vec_Int_t * vAlphas, * vStr2Sta, * vStaLits;
    Vec_Int_t * vStaTrans, * vStack, * vVisited;
    Vec_Str_t * vInit;
    char * pStr = Gia_ManRexPreprocess( pStrInit );
    int nStates = Gia_ManRexNumInputs( pStr, &vAlphas, &vStr2Sta );
    int i, k, iLit, Entry, nLength = strlen(pStr), nTravId = 1;
    if ( fOrder )
        Vec_IntSort( vAlphas, 0 );
//    if ( fVerbose )
    {
        printf( "Input variable order: " );
        Vec_IntForEachEntry( vAlphas, Entry, k )
            printf( "%c", (char)Entry );
        printf( "\n" );
    }
    // start AIG
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pStrInit );
    for ( i = 0; i < Vec_IntSize(vAlphas) + nStates; i++ )
        Gia_ManAppendCi( pNew );
    // prepare automaton
    vStaLits  = Vec_IntStart( nStates + 1 );
    vStaTrans = Vec_IntStartFull( nLength );
    vStack    = Vec_IntAlloc( nLength );
    vVisited  = Vec_IntStartFull( nLength + 1 );
    for ( i = 0; i < nLength; i++ )
    {
        int Lp = i;
        if ( pStr[i] == '(' || pStr[i] == '|' )
            Vec_IntPush( vStack, i );
        else if ( pStr[i] == ')' )
        {
            int Or = Vec_IntPop( vStack );
            if ( pStr[Or] == '|' )
            {
                Lp = Vec_IntPop( vStack );
                Vec_IntWriteEntry( vStaTrans, Lp, Or + 1 );
                Vec_IntWriteEntry( vStaTrans, Or, i );
            }
            else
                Lp = Or;
        }
        if ( i < nLength - 1 && pStr[i+1] == '*' )
        {
            Vec_IntWriteEntry( vStaTrans, Lp, i+1 );
            Vec_IntWriteEntry( vStaTrans, i+1, Lp );
        }
    }
    assert( Vec_IntSize(vStack) == 0 );
    if ( fVerbose )
        Gia_ManPrintAutom( pStr, vStaTrans );

    // create next-state functions for each state
    Gia_ManHashAlloc( pNew );
    for ( i = 1; i < nLength; i++ )
    {
        int iThis, iThat, iThisLit, iInputLit;
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        Gia_ManCollectReached( pStr, vStaTrans, i, vStack, vVisited, nTravId++ );
        if ( fVerbose )
            Gia_ManPrintReached( pStr, i, vStack );
        // create transitions from this state under this input
        iThis = Vec_IntEntry(vStr2Sta, i);
        iThisLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntSize(vAlphas) + iThis));
        iInputLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntFind(vAlphas, pStr[i])));
        iLit = Gia_ManHashAnd( pNew, iThisLit, iInputLit );
        Vec_IntForEachEntry( vStack, Entry, k )
        {
            iThat = Vec_IntEntry(vStr2Sta, Entry);
            iLit = Gia_ManHashOr( pNew, iLit, Vec_IntEntry(vStaLits, iThat) );
            Vec_IntWriteEntry( vStaLits, iThat, iLit );
        }
    }
    // create one-hotness
    Vec_IntClear( vStack );
    for ( i = 0; i < Vec_IntSize(vAlphas); i++ )
        Vec_IntPush( vStack, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, i)) );
    iLit = Gia_ManBuild1Hot( pNew, vStack );
    // combine with outputs
    Vec_IntForEachEntry( vStaLits, Entry, k )
        Vec_IntWriteEntry( vStaLits, k, Gia_ManHashAnd(pNew, iLit, Entry) );
    Gia_ManHashStop( pNew );

    // collect initial state
    Gia_ManCollectReached( pStr, vStaTrans, 0, vStack, vVisited, nTravId++ );
    if ( fVerbose )
        Gia_ManPrintReached( pStr, 0, vStack );
    vInit = Vec_StrStart( nStates + 1 );
    Vec_StrFill( vInit, nStates, '0' );
    Vec_IntForEachEntry( vStack, Entry, k )
        if ( pStr[Entry] != '\0' )
            Vec_StrWriteEntry( vInit, Vec_IntEntry(vStr2Sta, Entry), '1' );
    if ( fVerbose )
        printf( "Init state = %s\n", Vec_StrArray(vInit) );

    // add outputs
    Vec_IntPushFirst( vStaLits, Vec_IntPop(vStaLits) );
    assert( Vec_IntSize(vStaLits) == nStates + 1 );
    Vec_IntForEachEntry( vStaLits, iLit, i )
        Gia_ManAppendCo( pNew, iLit );
    Gia_ManSetRegNum( pNew, nStates );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // add initial state
    pNew = Gia_ManDupZeroUndc( pTemp = pNew, Vec_StrArray(vInit), 0, 0, 0 );
    Gia_ManStop( pTemp );
    Vec_StrFree( vInit );
/*
    Gia_ManAutomSimulate( pNew, vAlphas, "0" );
    Gia_ManAutomSimulate( pNew, vAlphas, "01" );
    Gia_ManAutomSimulate( pNew, vAlphas, "110" );
    Gia_ManAutomSimulate( pNew, vAlphas, "011" );
    Gia_ManAutomSimulate( pNew, vAlphas, "111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1010" );

    Gia_ManAutomSimulate( pNew, vAlphas, "A" );
    Gia_ManAutomSimulate( pNew, vAlphas, "AD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "ABCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "BCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "CD" );
*/

    // cleanup
    Vec_IntFree( vAlphas );
    Vec_IntFree( vStr2Sta );
    Vec_IntFree( vStaLits );
    Vec_IntFree( vStaTrans );
    Vec_IntFree( vStack );
    Vec_IntFree( vVisited );
    ABC_FREE( pStr );
    return pNew;
}